

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

uint32_t __thiscall testing::internal::Random::Generate(Random *this,uint32_t range)

{
  bool bVar1;
  ostream *poVar2;
  uint in_ESI;
  uint *in_RDI;
  GTestLog *unaff_retaddr;
  GTestLog *in_stack_ffffffffffffff80;
  GTestLog local_20 [3];
  int in_stack_ffffffffffffffec;
  GTestLog in_stack_fffffffffffffff0;
  uint *puVar3;
  GTestLogSeverity severity;
  
  *in_RDI = (*in_RDI * 0x41c64e6d + 0x3039) % 0x80000000;
  puVar3 = in_RDI;
  bVar1 = IsTrue(in_ESI != 0);
  severity = (GTestLogSeverity)((ulong)puVar3 >> 0x20);
  if (!bVar1) {
    GTestLog::GTestLog(unaff_retaddr,severity,
                       (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0.severity_),
                       in_stack_ffffffffffffffec);
    poVar2 = GTestLog::GetStream((GTestLog *)&stack0xfffffffffffffff0);
    poVar2 = std::operator<<(poVar2,"Condition range > 0 failed. ");
    std::operator<<(poVar2,"Cannot generate a number in the range [0, 0).");
    GTestLog::~GTestLog(in_stack_ffffffffffffff80);
  }
  bVar1 = IsTrue(in_ESI < 0x80000001);
  if (!bVar1) {
    GTestLog::GTestLog(unaff_retaddr,severity,
                       (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0.severity_),
                       in_stack_ffffffffffffffec);
    poVar2 = GTestLog::GetStream(local_20);
    poVar2 = std::operator<<(poVar2,"Condition range <= kMaxRange failed. ");
    poVar2 = std::operator<<(poVar2,"Generation of a number in [0, ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
    poVar2 = std::operator<<(poVar2,") was requested, ");
    poVar2 = std::operator<<(poVar2,"but this can only generate numbers in [0, ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x80000000);
    std::operator<<(poVar2,").");
    GTestLog::~GTestLog((GTestLog *)poVar2);
  }
  return *in_RDI % in_ESI;
}

Assistant:

uint32_t Random::Generate(uint32_t range) {
  // These constants are the same as are used in glibc's rand(3).
  // Use wider types than necessary to prevent unsigned overflow diagnostics.
  state_ = static_cast<uint32_t>(1103515245ULL*state_ + 12345U) % kMaxRange;

  GTEST_CHECK_(range > 0)
      << "Cannot generate a number in the range [0, 0).";
  GTEST_CHECK_(range <= kMaxRange)
      << "Generation of a number in [0, " << range << ") was requested, "
      << "but this can only generate numbers in [0, " << kMaxRange << ").";

  // Converting via modulus introduces a bit of downward bias, but
  // it's simple, and a linear congruential generator isn't too good
  // to begin with.
  return state_ % range;
}